

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * abstract_array_static_declarator(dmr_C *C,token *token,int *has_static)

{
  global_symbols_t *pgVar1;
  bool bVar2;
  
  pgVar1 = C->S;
  if ((ident *)(token->field_2).number == pgVar1->static_ident) {
    bVar2 = *has_static == 0;
    do {
      if (!bVar2) {
        dmrC_sparse_error(C,token->pos,"duplicate array static declarator");
        pgVar1 = C->S;
      }
      *has_static = 1;
      token = *(token **)((long)token + 8);
      bVar2 = false;
    } while (*(ident **)((long)token + 0x10) == pgVar1->static_ident);
  }
  return (token *)(position)token;
}

Assistant:

static struct token *abstract_array_static_declarator(struct dmr_C *C, struct token *token, int *has_static)
{
	while (token->ident == C->S->static_ident) {
		if (*has_static)
			dmrC_sparse_error(C, token->pos, "duplicate array static declarator");

		*has_static = 1;
		token = token->next;
	}
	return token;

}